

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable_ptr.h
# Opt level: O2

void __thiscall tower120::detail::trackable_ptr_base::~trackable_ptr_base(trackable_ptr_base *this)

{
  trackable_base *ptVar1;
  trackable_ptr_base *ptVar2;
  trackable_ptr_base *ptVar3;
  
  ptVar1 = this->obj;
  if (ptVar1 != (trackable_base *)0x0) {
    ptVar2 = this->prev;
    if (ptVar2 == (trackable_ptr_base *)0x0) {
      if (ptVar1->first_ptr != this) {
        __assert_fail("obj->first_ptr == this",
                      "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/include/tower120/trackable_ptr.h"
                      ,0x5e,"tower120::detail::trackable_ptr_base::~trackable_ptr_base()");
      }
      ptVar3 = this->next;
      ptVar1->first_ptr = ptVar3;
    }
    else {
      ptVar3 = this->next;
      ptVar2->next = ptVar3;
    }
    if (ptVar3 != (trackable_ptr_base *)0x0) {
      ptVar3->prev = ptVar2;
    }
  }
  return;
}

Assistant:

~trackable_ptr_base() noexcept {
                if(!obj) return;

                if (prev) {
                    prev->next = next;
                } else {
                    assert(obj->first_ptr == this);
                    obj->first_ptr = next;
                }

                if (next) next->prev = prev;
            }